

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_mconfig.cpp
# Opt level: O0

void test_save_and_load<QDateTime>(QDateTime *userValue)

{
  Format local_ec;
  QString local_e8;
  undefined1 local_d0 [8];
  SimpleConfig<QDateTime> config2;
  Format local_74;
  QString local_70;
  undefined1 local_58 [8];
  SimpleConfig<QDateTime> config1;
  QDateTime *userValue_local;
  
  config1._64_8_ = userValue;
  SimpleConfig<QDateTime>::SimpleConfig((SimpleConfig<QDateTime> *)local_58);
  QDateTime::operator=((QDateTime *)&config1.super_MConfig.mValues,userValue);
  QString::QString(&local_70);
  local_74 = IniFormat;
  MBaseConfig::save((MBaseConfig *)local_58,&local_70,&local_74);
  QString::~QString(&local_70);
  SimpleConfig<QDateTime>::SimpleConfig((SimpleConfig<QDateTime> *)local_d0);
  QString::QString(&local_e8);
  local_ec = IniFormat;
  MBaseConfig::load((MBaseConfig *)local_d0,&local_e8,&local_ec);
  QString::~QString(&local_e8);
  QTest::qCompare<QDateTime,QDateTime>
            ((QDateTime *)&config1.super_MConfig.mValues,(QDateTime *)&config2.super_MConfig.mValues
             ,"config1.value","config2.value",
             "/workspace/llm4binary/github/license_all_cmakelists_25/milosolutions[P]mconfig/tst_mconfig/tst_mconfig.cpp"
             ,0x5b);
  SimpleConfig<QDateTime>::~SimpleConfig((SimpleConfig<QDateTime> *)local_d0);
  SimpleConfig<QDateTime>::~SimpleConfig((SimpleConfig<QDateTime> *)local_58);
  return;
}

Assistant:

void test_save_and_load(T userValue)
{
    SimpleConfig<T> config1;
    config1.value = userValue;
    config1.save();
    SimpleConfig<T> config2;
    config2.load();
    QCOMPARE(config1.value, config2.value);
}